

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key,uECC_Curve curve)

{
  char cVar1;
  cmpresult_t cVar2;
  uint uVar3;
  uECC_word_t uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  char cVar9;
  int iVar10;
  uECC_word_t _private [4];
  uECC_word_t _public [8];
  uECC_word_t local_88 [4];
  uECC_word_t local_68 [9];
  
  iVar10 = (int)curve->num_n_bits;
  iVar6 = iVar10 + 0xe;
  if (-1 < iVar10 + 7) {
    iVar6 = iVar10 + 7;
  }
  uECC_vli_bytesToNative(local_88,private_key,iVar6 >> 3);
  iVar6 = iVar10 + 0x7e;
  if (-1 < iVar10 + 0x3f) {
    iVar6 = iVar10 + 0x3f;
  }
  cVar9 = (char)(iVar6 >> 6);
  if (cVar9 < '\x01') {
    iVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 | local_88[uVar5];
      uVar5 = uVar5 + 1;
    } while ((iVar6 >> 6 & 0x7f) != uVar5);
    iVar6 = 0;
    if (((uVar7 != 0) && (cVar2 = uECC_vli_cmp(curve->n,local_88,cVar9), iVar6 = 0, cVar2 == '\x01')
        ) && (uVar4 = EccPoint_compute_public_key(local_68,local_88,curve), uVar4 != 0)) {
      uVar3 = (uint)curve->num_bytes;
      if ('\0' < curve->num_bytes) {
        uVar5 = (ulong)uVar3;
        iVar6 = uVar3 * 8;
        uVar7 = 0;
        do {
          iVar6 = iVar6 + -8;
          uVar3 = uVar3 - 1;
          public_key[uVar7] =
               (uint8_t)(*(ulong *)((long)local_68 + (ulong)(uVar3 & 0xfffffff8)) >>
                        ((byte)iVar6 & 0x38));
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar5);
      }
      cVar9 = curve->num_bytes;
      iVar6 = 1;
      if (0 < (long)cVar9) {
        cVar1 = curve->num_words;
        uVar3 = (uint)cVar9;
        uVar5 = (ulong)uVar3;
        bVar8 = cVar9 * '\b';
        uVar7 = 0;
        do {
          uVar3 = uVar3 - 1;
          bVar8 = bVar8 - 8;
          public_key[uVar7 + (long)cVar9] =
               (uint8_t)(*(ulong *)((long)local_68 + (ulong)(uVar3 & 0xfffffff8) + (long)cVar1 * 8)
                        >> (bVar8 & 0x38));
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar5);
      }
    }
  }
  return iVar6;
}

Assistant:

int uECC_compute_public_key(const uint8_t *private_key, uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_private = (uECC_word_t *)private_key;
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _private[uECC_MAX_WORDS];
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_private, private_key, BITS_TO_BYTES(curve->num_n_bits));
#endif

    /* Make sure the private key is in the range [1, n-1]. */
    if (uECC_vli_isZero(_private, BITS_TO_WORDS(curve->num_n_bits))) {
        return 0;
    }

    if (uECC_vli_cmp(curve->n, _private, BITS_TO_WORDS(curve->num_n_bits)) != 1) {
        return 0;
    }

    /* Compute public key. */
    if (!EccPoint_compute_public_key(_public, _private, curve)) {
        return 0;
    }

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
    uECC_vli_nativeToBytes(
        public_key + curve->num_bytes, curve->num_bytes, _public + curve->num_words);
#endif
    return 1;
}